

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
 __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::Make(TimeZoneInfo *this,string *name)

{
  bool bVar1;
  TimeZoneInfo *this_00;
  pointer this_01;
  string *name_local;
  unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
  *tz;
  
  this_00 = (TimeZoneInfo *)operator_new(0xc0);
  TimeZoneInfo(this_00);
  std::
  unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>>
  ::unique_ptr<std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>,void>
            ((unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>>
              *)this,this_00);
  this_01 = std::
            unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
            ::operator->((unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
                          *)this);
  bVar1 = Load(this_01,name);
  if (!bVar1) {
    std::
    unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
    ::reset((unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
             *)this,(pointer)0x0);
  }
  return (__uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneInfo> TimeZoneInfo::Make(const std::string& name) {
  auto tz = std::unique_ptr<TimeZoneInfo>(new TimeZoneInfo);
  if (!tz->Load(name)) tz.reset();  // fallback to UTC
  return tz;
}